

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.h
# Opt level: O3

void __thiscall DIS::GroupIdentifier::setSimulationAddress(GroupIdentifier *this,EntityType *pX)

{
  uchar uVar1;
  unsigned_short uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  
  uVar1 = pX->_domain;
  uVar2 = pX->_country;
  uVar3 = pX->_category;
  uVar4 = pX->_subcategory;
  uVar5 = pX->_specific;
  uVar6 = pX->_extra;
  (this->_simulationAddress)._entityKind = pX->_entityKind;
  (this->_simulationAddress)._domain = uVar1;
  (this->_simulationAddress)._country = uVar2;
  (this->_simulationAddress)._category = uVar3;
  (this->_simulationAddress)._subcategory = uVar4;
  (this->_simulationAddress)._specific = uVar5;
  (this->_simulationAddress)._extra = uVar6;
  return;
}

Assistant:

class OPENDIS7_EXPORT EntityType
{
protected:
  /** Kind of entity */
  unsigned char _entityKind; 

  /** Domain of entity (air, surface, subsurface, space, etc) */
  unsigned char _domain; 

  /** country to which the design of the entity is attributed */
  unsigned short _country; 

  /** category of entity */
  unsigned char _category; 

  /** subcategory of entity */
  unsigned char _subcategory; 

  /** specific info based on subcategory field. Renamed from specific because that is a reserved word in SQL. */
  unsigned char _specific; 

  unsigned char _extra; 


 public:
    EntityType();
    virtual ~EntityType();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned char getEntityKind() const; 
    void setEntityKind(unsigned char pX); 

    unsigned char getDomain() const; 
    void setDomain(unsigned char pX); 

    unsigned short getCountry() const; 
    void setCountry(unsigned short pX); 

    unsigned char getCategory() const; 
    void setCategory(unsigned char pX); 

    unsigned char getSubcategory() const; 
    void setSubcategory(unsigned char pX); 

    unsigned char getSpecific() const; 
    void setSpecific(unsigned char pX); 

    unsigned char getExtra() const; 
    void setExtra(unsigned char pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const EntityType& rhs) const;
}